

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O2

double __thiscall hdc::SymbolTableBuilderVisitor::log(SymbolTableBuilderVisitor *this,double __x)

{
  Logger *this_00;
  long in_RSI;
  double dVar1;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  
  this_00 = this->logger;
  if (this_00 != (Logger *)0x0) {
    dVar1 = (double)std::__cxx11::stringbuf::str();
    Logger::log(this_00,dVar1);
    std::__cxx11::string::~string(local_38);
  }
  std::__cxx11::string::string(local_58,"",&local_59);
  std::__cxx11::stringbuf::str((string *)(in_RSI + 0x18));
  dVar1 = (double)std::__cxx11::string::~string(local_58);
  return dVar1;
}

Assistant:

void SymbolTableBuilderVisitor::log(std::stringstream& msg) {
    if (logger != nullptr) {
        logger->log(LOG_INTERNAL_SYMBOL_TABLE, msg.str());
    }

    msg.str("");
}